

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O1

_Bool sysbvm_identitySet_findWithExplicitHash
                (sysbvm_context_t *context,sysbvm_tuple_t set,void *element,
                sysbvm_identitySet_explicitHashFunction_t hashFunction,
                sysbvm_identitySet_explicitEqualsFunction_t equalsFunction,
                sysbvm_tuple_t *outFoundElement)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  bool bVar3;
  _Bool _Var4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  byte unaff_BPL;
  ulong uVar8;
  bool bVar9;
  
  *outFoundElement = 0;
  if ((set & 0xf) == 0 && set != 0) {
    uVar1 = *(ulong *)(set + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar7 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
    }
    else {
      uVar7 = 0;
    }
    if (uVar7 != 0) {
      sVar5 = (*hashFunction)(context,element);
      uVar6 = sVar5 % uVar7;
      bVar9 = true;
      uVar8 = uVar6;
      do {
        sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar8 * 8);
        if (sVar2 == 0x3f) {
          bVar3 = false;
          unaff_BPL = 0;
        }
        else {
          _Var4 = (*equalsFunction)(element,sVar2);
          bVar3 = true;
          if (_Var4) {
            *outFoundElement = sVar2;
            unaff_BPL = 1;
            bVar3 = false;
          }
        }
        if (!bVar3) break;
        uVar8 = uVar8 + 1;
        bVar9 = uVar8 < uVar7;
      } while (bVar9);
      if (bVar9) goto LAB_00136412;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
          if (sVar2 == 0x3f) {
            bVar9 = false;
            unaff_BPL = 0;
          }
          else {
            _Var4 = (*equalsFunction)(element,sVar2);
            bVar9 = true;
            if (_Var4) {
              *outFoundElement = sVar2;
              unaff_BPL = 1;
              bVar9 = false;
            }
          }
          if (!bVar9) goto LAB_00136412;
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar6);
      }
    }
  }
  unaff_BPL = 0;
LAB_00136412:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_findWithExplicitHash(sysbvm_context_t *context, sysbvm_tuple_t set, void *element, sysbvm_identitySet_explicitHashFunction_t hashFunction, sysbvm_identitySet_explicitEqualsFunction_t equalsFunction, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    if(capacity == 0)
        return false;

    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    size_t hashIndex = hashFunction(context, element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    return false;
}